

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glucose.cpp
# Opt level: O0

void __thiscall Gluco::Solver::reduceDB(Solver *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  uint *puVar5;
  Clause *pCVar6;
  Clause *c;
  reduceDB_lt rStack_20;
  int limit;
  int local_18;
  int local_14;
  int j;
  int i;
  Solver *this_local;
  
  this->nbReduceDB = this->nbReduceDB + 1;
  _j = this;
  reduceDB_lt::reduceDB_lt(&stack0xffffffffffffffe0,&this->ca);
  sort<unsigned_int,reduceDB_lt>(&this->learnts,rStack_20);
  iVar2 = vec<unsigned_int>::size(&this->learnts);
  puVar5 = vec<unsigned_int>::operator[](&this->learnts,iVar2 / 2);
  pCVar6 = ClauseAllocator::operator[](&this->ca,*puVar5);
  uVar3 = Clause::lbd(pCVar6);
  if (uVar3 < 4) {
    this->nbclausesbeforereduce = this->specialIncReduceDB + this->nbclausesbeforereduce;
  }
  puVar5 = vec<unsigned_int>::last(&this->learnts);
  pCVar6 = ClauseAllocator::operator[](&this->ca,*puVar5);
  uVar3 = Clause::lbd(pCVar6);
  if (uVar3 < 6) {
    this->nbclausesbeforereduce = this->specialIncReduceDB + this->nbclausesbeforereduce;
  }
  iVar2 = vec<unsigned_int>::size(&this->learnts);
  c._4_4_ = iVar2 / 2;
  local_18 = 0;
  for (local_14 = 0; iVar2 = local_14, iVar4 = vec<unsigned_int>::size(&this->learnts),
      iVar2 < iVar4; local_14 = local_14 + 1) {
    puVar5 = vec<unsigned_int>::operator[](&this->learnts,local_14);
    pCVar6 = ClauseAllocator::operator[](&this->ca,*puVar5);
    uVar3 = Clause::lbd(pCVar6);
    if ((((uVar3 < 3) || (iVar2 = Clause::size(pCVar6), iVar2 < 3)) ||
        (bVar1 = Clause::canBeDel(pCVar6), !bVar1)) ||
       ((bVar1 = locked(this,pCVar6), bVar1 || (c._4_4_ <= local_14)))) {
      bVar1 = Clause::canBeDel(pCVar6);
      if (!bVar1) {
        c._4_4_ = c._4_4_ + 1;
      }
      Clause::setCanBeDel(pCVar6,true);
      puVar5 = vec<unsigned_int>::operator[](&this->learnts,local_14);
      iVar2 = local_18;
      uVar3 = *puVar5;
      local_18 = local_18 + 1;
      puVar5 = vec<unsigned_int>::operator[](&this->learnts,iVar2);
      *puVar5 = uVar3;
    }
    else {
      puVar5 = vec<unsigned_int>::operator[](&this->learnts,local_14);
      removeClause(this,*puVar5);
      this->nbRemovedClauses = this->nbRemovedClauses + 1;
    }
  }
  vec<unsigned_int>::shrink(&this->learnts,local_14 - local_18);
  checkGarbage(this);
  return;
}

Assistant:

void Solver::reduceDB()
{ 
  int i, j;
  nbReduceDB++;
  sort(learnts, reduceDB_lt(ca));

  // We have a lot of "good" clauses, it is difficult to compare them. Keep more !
  if(ca[learnts[learnts.size() / RATIOREMOVECLAUSES]].lbd()<=3) nbclausesbeforereduce +=specialIncReduceDB; 
  // Useless :-)
  if(ca[learnts.last()].lbd()<=5)  nbclausesbeforereduce +=specialIncReduceDB;   
  
  // Don't delete binary or locked clauses. From the rest, delete clauses from the first half
  // Keep clauses which seem to be usefull (their lbd was reduce during this sequence)

  int limit = learnts.size() / 2;
  for (i = j = 0; i < learnts.size(); i++){
    Clause& c = ca[learnts[i]];
    if (c.lbd()>2 && c.size() > 2 && c.canBeDel() &&  !locked(c) && (i < limit)) {
      removeClause(learnts[i]);
      nbRemovedClauses++;
    }
    else {
      if(!c.canBeDel()) limit++; //we keep c, so we can delete an other clause
      c.setCanBeDel(true);       // At the next step, c can be delete
      learnts[j++] = learnts[i];
    }
  }
  learnts.shrink(i - j);
  checkGarbage();
}